

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O1

void __thiscall aiMetadata::Add<aiString>(aiMetadata *this,string *key,aiString *value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  aiMetadataEntry *paVar5;
  undefined8 uVar6;
  aiString *paVar7;
  aiMetadataEntry *paVar8;
  uint *puVar9;
  aiString *paVar10;
  char *__src;
  ulong uVar11;
  long lVar12;
  char *__dest;
  
  uVar3 = this->mNumProperties;
  uVar11 = (ulong)(uVar3 + 1);
  paVar7 = (aiString *)operator_new__(uVar11 * 0x404);
  if (uVar3 != 0xffffffff) {
    paVar10 = paVar7;
    do {
      paVar10->length = 0;
      paVar10->data[0] = '\0';
      memset(paVar10->data + 1,0x1b,0x3ff);
      paVar10 = paVar10 + 1;
    } while (paVar10 != paVar7 + uVar11);
  }
  paVar8 = (aiMetadataEntry *)operator_new__(uVar11 << 4);
  if ((ulong)uVar3 != 0) {
    paVar10 = this->mKeys;
    paVar5 = this->mValues;
    __src = paVar10->data;
    __dest = paVar7->data;
    lVar12 = 0;
    do {
      if (paVar7 != paVar10) {
        uVar4 = ((aiString *)(__src + -4))->length;
        ((aiString *)(__dest + -4))->length = uVar4;
        memcpy(__dest,__src,(ulong)uVar4);
        __dest[uVar4] = '\0';
      }
      puVar1 = (undefined8 *)((long)&paVar5->mType + lVar12);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&paVar8->mType + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      __src = __src + 0x404;
      __dest = __dest + 0x404;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar12);
  }
  if (this->mKeys != (aiString *)0x0) {
    operator_delete__(this->mKeys);
  }
  if (this->mValues != (aiMetadataEntry *)0x0) {
    operator_delete__(this->mValues);
  }
  this->mKeys = paVar7;
  this->mValues = paVar8;
  uVar3 = this->mNumProperties;
  this->mNumProperties = uVar3 + 1;
  if ((uVar3 + 1 != 0) && (uVar11 = key->_M_string_length, uVar11 != 0)) {
    if (uVar11 < 0x400) {
      paVar7[uVar3].length = (ai_uint32)uVar11;
      memcpy(paVar7[uVar3].data,(key->_M_dataplus)._M_p,uVar11);
      paVar7[uVar3].data[uVar11] = '\0';
    }
    this->mValues[uVar3].mType = AI_AISTRING;
    puVar9 = (uint *)operator_new(0x404);
    uVar4 = 0x3ff;
    if (value->length < 0x3ff) {
      uVar4 = value->length;
    }
    *puVar9 = uVar4;
    memcpy(puVar9 + 1,value->data,(ulong)uVar4);
    *(undefined1 *)((long)puVar9 + (ulong)uVar4 + 4) = 0;
    this->mValues[uVar3].mData = puVar9;
  }
  return;
}

Assistant:

inline
    void Add(const std::string& key, const T& value) {
		aiString* new_keys = new aiString[mNumProperties + 1];
		aiMetadataEntry* new_values = new aiMetadataEntry[mNumProperties + 1];

		for(unsigned int i = 0; i < mNumProperties; ++i)
		{
			new_keys[i] = mKeys[i];
			new_values[i] = mValues[i];
		}

		delete[] mKeys;
		delete[] mValues;

		mKeys = new_keys;
		mValues = new_values;

		mNumProperties++;

		Set(mNumProperties - 1, key, value);
	}